

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MS5837.cpp
# Opt level: O0

void * MS5837Thread(void *pParam)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  double dVar4;
  double local_a30;
  interval local_a28;
  double local_a10;
  interval local_a08;
  interval local_9f0;
  char local_9d8 [8];
  char szTemp [256];
  char szSaveFilePath [256];
  int local_7d0;
  int i;
  int errcount;
  int threadperiod;
  CHRONO chrono_period;
  undefined1 local_778 [4];
  BOOL bConnected;
  CHRONO chrono_filter;
  double filteredpressure;
  double pressure_prev;
  MS5837DATA ms5837data;
  MS5837 ms5837;
  void *pParam_local;
  
  filteredpressure = 0.0;
  chrono_filter.Suspended = 0;
  chrono_filter._68_4_ = 0;
  chrono_period._68_4_ = 0;
  i = 0x32;
  local_7d0 = 0;
  ms5837.WaterDensity = (double)pParam;
  memset(&ms5837data.Pressure,0,0x6e8);
  StartChrono((CHRONO *)local_778);
  StartChrono((CHRONO *)&errcount);
  do {
    while( true ) {
      StopChronoQuick((CHRONO *)&errcount);
      StartChrono((CHRONO *)&errcount);
      mSleep((long)i);
      if (bPauseMS5837 == 0) break;
      if (chrono_period._68_4_ != 0) {
        printf("MS5837 paused.\n");
        chrono_period._68_4_ = 0;
        DisconnectMS5837((MS5837 *)&ms5837data.Pressure);
      }
      if (bExit != 0) goto LAB_001ccf52;
      mSleep(100);
    }
    if (bRestartMS5837 != 0) {
      if (chrono_period._68_4_ != 0) {
        printf("Restarting a MS5837.\n");
        chrono_period._68_4_ = 0;
        DisconnectMS5837((MS5837 *)&ms5837data.Pressure);
      }
      bRestartMS5837 = 0;
    }
    if (chrono_period._68_4_ == 0) {
      iVar1 = ConnectMS5837((MS5837 *)&ms5837data.Pressure,"MS58370.txt");
      if (iVar1 == 0) {
        chrono_period._68_4_ = 1;
        i = ms5837.nbretries;
        memset(&pressure_prev,0,0x28);
        StopChronoQuick((CHRONO *)local_778);
        StartChrono((CHRONO *)local_778);
        if (ms5837._1128_8_ != 0) {
          fclose((FILE *)ms5837._1128_8_);
          ms5837.ms5837_coeff_read = 0;
          ms5837._1132_4_ = 0;
        }
        if ((ms5837.timeout != 0) && (ms5837._1128_8_ == 0)) {
          sVar2 = strlen((char *)&ms5837.LastMS5837Data.Pressure);
          if (sVar2 == 0) {
            sprintf(local_9d8,"ms5837");
          }
          else {
            sprintf(local_9d8,"%.127s",&ms5837.LastMS5837Data.Pressure);
          }
          sVar2 = strlen(local_9d8);
          szSaveFilePath._252_4_ = (undefined4)sVar2;
          do {
            szSaveFilePath._252_4_ = szSaveFilePath._252_4_ + -1;
            if ((int)szSaveFilePath._252_4_ < 0) break;
          } while (local_9d8[(int)szSaveFilePath._252_4_] != '.');
          if ((0 < (int)szSaveFilePath._252_4_) &&
             (sVar2 = strlen(local_9d8), (int)szSaveFilePath._252_4_ < (int)sVar2)) {
            sVar2 = strlen(local_9d8);
            memset(local_9d8 + (int)szSaveFilePath._252_4_,0,
                   sVar2 - (long)(int)szSaveFilePath._252_4_);
          }
          EnterCriticalSection(&strtimeCS);
          pcVar3 = strtimeex_fns();
          sprintf(szTemp + 0xf8,"log/%.127s_%.64s.txt",local_9d8,pcVar3);
          LeaveCriticalSection(&strtimeCS);
          ms5837._1128_8_ = fopen(szTemp + 0xf8,"w");
          if ((FILE *)ms5837._1128_8_ == (FILE *)0x0) {
            printf("Unable to create MS5837 data file.\n");
            goto LAB_001ccf52;
          }
        }
      }
      else {
        chrono_period._68_4_ = 0;
        mSleep(1000);
      }
    }
    else {
      iVar1 = GetLatestDataMS5837((MS5837 *)&ms5837data.Pressure,(MS5837DATA *)&pressure_prev);
      if (iVar1 == 0) {
        EnterCriticalSection(&StateVariablesCS);
        pressure_mes = ms5837data.altitude;
        dVar4 = GetTimeElapsedChronoQuick((CHRONO *)local_778);
        if ((2.0 < dVar4) && (dVar4 = GetTimeElapsedChronoQuick((CHRONO *)local_778), dVar4 <= 3.0))
        {
          filteredpressure = ms5837data.altitude;
        }
        dVar4 = GetTimeElapsedChronoQuick((CHRONO *)local_778);
        if (dVar4 <= 3.0) {
          chrono_filter._64_8_ = ms5837data.altitude;
        }
        else {
          chrono_filter._64_8_ = filteredpressure;
          if (ABS(ms5837data.altitude - filteredpressure) < 0.05) {
            filteredpressure = ms5837data.altitude;
            chrono_filter._64_8_ = filteredpressure;
          }
        }
        local_a10 = Pressure2Height((double)chrono_filter._64_8_,(double)ms5837._1744_8_,
                                    ms5837.PressureRef);
        interval::interval(&local_a08,&local_a10);
        local_a30 = -z_pressure_acc;
        interval::interval(&local_a28,&local_a30,&z_pressure_acc);
        operator+(&local_9f0,&local_a08,&local_a28);
        interval::operator=((interval *)&z_pressure,&local_9f0);
        LeaveCriticalSection(&StateVariablesCS);
      }
      else {
        printf("Connection to a MS5837 lost.\n");
        chrono_period._68_4_ = 0;
        DisconnectMS5837((MS5837 *)&ms5837data.Pressure);
      }
    }
    if (((chrono_period._68_4_ == 0) && (local_7d0 = local_7d0 + 1, 0 < ExitOnErrorCount)) &&
       (ExitOnErrorCount <= local_7d0)) {
      bExit = 1;
    }
    if (bExit != 0) {
LAB_001ccf52:
      StopChronoQuick((CHRONO *)&errcount);
      StopChronoQuick((CHRONO *)local_778);
      if (ms5837._1128_8_ != 0) {
        fclose((FILE *)ms5837._1128_8_);
        ms5837.ms5837_coeff_read = 0;
        ms5837._1132_4_ = 0;
      }
      if (chrono_period._68_4_ != 0) {
        DisconnectMS5837((MS5837 *)&ms5837data.Pressure);
      }
      if (bExit == 0) {
        bExit = 1;
      }
      return (void *)0x0;
    }
  } while( true );
}

Assistant:

THREAD_PROC_RETURN_VALUE MS5837Thread(void* pParam)
{
	MS5837 ms5837;
	MS5837DATA ms5837data;
	double pressure_prev = 0, filteredpressure = 0;
	CHRONO chrono_filter;
	BOOL bConnected = FALSE;
	CHRONO chrono_period;
	int threadperiod = 50;
	int errcount = 0;
	int i = 0;
	char szSaveFilePath[256];
	char szTemp[256];

	UNREFERENCED_PARAMETER(pParam);

	memset(&ms5837, 0, sizeof(MS5837));

	StartChrono(&chrono_filter);

	StartChrono(&chrono_period);

	for (;;)
	{
		StopChronoQuick(&chrono_period);
		StartChrono(&chrono_period);

		mSleep(threadperiod);

		if (bPauseMS5837) 
		{ 
			if (bConnected)
			{
				printf("MS5837 paused.\n");
				bConnected = FALSE;
				DisconnectMS5837(&ms5837);
			}
			if (bExit) break;
			mSleep(100);
			continue;
		}

		if (bRestartMS5837) 
		{ 
			if (bConnected)
			{
				printf("Restarting a MS5837.\n");
				bConnected = FALSE;
				DisconnectMS5837(&ms5837);
			}
			bRestartMS5837 = FALSE;
		}

		if (!bConnected)
		{
			if (ConnectMS5837(&ms5837, "MS58370.txt") == EXIT_SUCCESS) 
			{
				bConnected = TRUE; 
				threadperiod = ms5837.threadperiod;

				memset(&ms5837data, 0, sizeof(ms5837data));
				StopChronoQuick(&chrono_filter);
				StartChrono(&chrono_filter);

				if (ms5837.pfSaveFile != NULL)
				{
					fclose(ms5837.pfSaveFile); 
					ms5837.pfSaveFile = NULL;
				}
				if ((ms5837.bSaveRawData)&&(ms5837.pfSaveFile == NULL)) 
				{
					if (strlen(ms5837.szCfgFilePath) > 0)
					{
						sprintf(szTemp, "%.127s", ms5837.szCfgFilePath);
					}
					else
					{
						sprintf(szTemp, "ms5837");
					}
					// Remove the extension.
					for (i = (int)strlen(szTemp)-1; i >= 0; i--) { if (szTemp[i] == '.') break; }
					if ((i > 0)&&(i < (int)strlen(szTemp))) memset(szTemp+i, 0, strlen(szTemp)-i);
					//if (strlen(szTemp) > 4) memset(szTemp+strlen(szTemp)-4, 0, 4);
					EnterCriticalSection(&strtimeCS);
					sprintf(szSaveFilePath, LOG_FOLDER"%.127s_%.64s.txt", szTemp, strtimeex_fns());
					LeaveCriticalSection(&strtimeCS);
					ms5837.pfSaveFile = fopen(szSaveFilePath, "w");
					if (ms5837.pfSaveFile == NULL) 
					{
						printf("Unable to create MS5837 data file.\n");
						break;
					}
				}
			}
			else 
			{
				bConnected = FALSE;
				mSleep(1000);
			}
		}
		else
		{
			if (GetLatestDataMS5837(&ms5837, &ms5837data) == EXIT_SUCCESS)
			{
				EnterCriticalSection(&StateVariablesCS);
				pressure_mes = ms5837data.Pressure;
				if ((GetTimeElapsedChronoQuick(&chrono_filter) > 2)&&(GetTimeElapsedChronoQuick(&chrono_filter) <= 3))
				{
					pressure_prev = ms5837data.Pressure; // Initialization of pressure_prev...
				}
				if (GetTimeElapsedChronoQuick(&chrono_filter) > 3)
				{
					if (fabs(ms5837data.Pressure-pressure_prev) < 0.05)
					{
						filteredpressure = ms5837data.Pressure;
						pressure_prev = filteredpressure;
					}
					else
					{
						// Ignore outlier...
						filteredpressure = pressure_prev;
					}
				}
				else
				{
					filteredpressure = ms5837data.Pressure;
				}
				z_pressure = Pressure2Height(filteredpressure, ms5837.PressureRef, ms5837.WaterDensity)+interval(-z_pressure_acc, z_pressure_acc);
				LeaveCriticalSection(&StateVariablesCS);
			}
			else
			{
				printf("Connection to a MS5837 lost.\n");
				bConnected = FALSE;
				DisconnectMS5837(&ms5837);
			}
		}

		//printf("MS5837Thread period : %f s.\n", GetTimeElapsedChronoQuick(&chrono_period));
		if (!bConnected) { errcount++; if ((ExitOnErrorCount > 0)&&(errcount >= ExitOnErrorCount)) bExit = TRUE; }
		if (bExit) break;
	}

	StopChronoQuick(&chrono_period);

	StopChronoQuick(&chrono_filter);

	if (ms5837.pfSaveFile != NULL)
	{
		fclose(ms5837.pfSaveFile); 
		ms5837.pfSaveFile = NULL;
	}

	if (bConnected) DisconnectMS5837(&ms5837);

	if (!bExit) bExit = TRUE; // Unexpected program exit...

	return 0;
}